

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandTestCex(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  Abc_Ntk_t *pNtk_00;
  char *pcVar4;
  int iPoOld_1;
  int iPoOld;
  int fCheckAnd;
  int nOutputs;
  int c;
  Abc_Ntk_t *pNtk;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  iPoOld = 0;
  bVar1 = true;
  Extra_UtilGetoptReset();
  do {
    while( true ) {
      iVar2 = Extra_UtilGetopt(argc,argv,"Oah");
      if (iVar2 == -1) {
        if (pAbc->pCex == (Abc_Cex_t *)0x0) {
          Abc_Print(1,"There is no current cex.\n");
          return 0;
        }
        if (bVar1) {
          if (pAbc->pGia == (Gia_Man_t *)0x0) {
            Abc_Print(1,"And  AIG: There is no current network.\n");
          }
          else {
            iVar2 = Gia_ManPiNum(pAbc->pGia);
            if (iVar2 == pAbc->pCex->nPis) {
              uVar3 = pAbc->pCex->iPo;
              iVar2 = Gia_ManFindFailedPoCex(pAbc->pGia,pAbc->pCex,iPoOld);
              pAbc->pCex->iPo = iVar2;
              if (pAbc->pCex->iPo == -1) {
                Abc_Print(1,"And  AIG: The cex does not fail any outputs.\n");
              }
              else if (uVar3 == pAbc->pCex->iPo) {
                Abc_Print(1,"And  AIG: The cex is correct.\n");
              }
              else {
                Abc_Print(1,"And  AIG: The cex refined PO %d instead of PO %d.\n",
                          (ulong)(uint)pAbc->pCex->iPo,(ulong)uVar3);
              }
            }
            else {
              uVar3 = Gia_ManPiNum(pAbc->pGia);
              Abc_Print(1,"And  AIG: The number of PIs (%d) is different from cex (%d).\n",
                        (ulong)uVar3,(ulong)(uint)pAbc->pCex->nPis);
            }
          }
        }
        else {
          pNtk_00 = Abc_FrameReadNtk(pAbc);
          if (pNtk_00 == (Abc_Ntk_t *)0x0) {
            Abc_Print(1,"Main AIG: There is no current network.\n");
          }
          else {
            iVar2 = Abc_NtkIsStrash(pNtk_00);
            if (iVar2 == 0) {
              Abc_Print(1,"Main AIG: The current network is not an AIG.\n");
            }
            else {
              iVar2 = Abc_NtkPiNum(pNtk_00);
              if (iVar2 == pAbc->pCex->nPis) {
                uVar3 = pAbc->pCex->iPo;
                iVar2 = Abc_NtkVerifyCex(pNtk_00,pAbc->pCex);
                pAbc->pCex->iPo = iVar2;
                if (pAbc->pCex->iPo == -1) {
                  Abc_Print(1,"Main AIG: The cex does not fail any outputs.\n");
                }
                else if (uVar3 == pAbc->pCex->iPo) {
                  Abc_Print(1,"Main AIG: The cex is correct.\n");
                }
                else {
                  Abc_Print(1,"Main AIG: The cex refined PO %d instead of PO %d.\n",
                            (ulong)(uint)pAbc->pCex->iPo,(ulong)uVar3);
                }
              }
              else {
                uVar3 = Abc_NtkPiNum(pNtk_00);
                Abc_Print(1,"Main AIG: The number of PIs (%d) is different from cex (%d).\n",
                          (ulong)uVar3,(ulong)(uint)pAbc->pCex->nPis);
              }
            }
          }
        }
        return 0;
      }
      if (iVar2 == 0x4f) break;
      if (iVar2 != 0x61) {
        if (iVar2 != 0x68) {
          Abc_Print(-2,"Unknown switch.\n");
        }
        goto LAB_002990f7;
      }
      bVar1 = (bool)(bVar1 ^ 1);
    }
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-O\" should be followed by an integer.\n");
      break;
    }
    iPoOld = atoi(argv[globalUtilOptind]);
    globalUtilOptind = globalUtilOptind + 1;
  } while (-1 < iPoOld);
LAB_002990f7:
  Abc_Print(-2,"usage: testcex [-O num] [-ah]\n");
  Abc_Print(-2,"\t         tests the current cex against the current AIG or the &-AIG\n");
  Abc_Print(-2,"\t-O num : the number of real POs in the PO list [default = %d]\n",
            (ulong)(uint)iPoOld);
  pcVar4 = "current AIG";
  if (bVar1) {
    pcVar4 = "&-AIG";
  }
  Abc_Print(-2,"\t-a     : toggle checking the current AIG or the &-AIG [default = %s]\n",pcVar4);
  Abc_Print(-2,"\t-h     : print the command usage\n");
  return 1;
}

Assistant:

int Abc_CommandTestCex( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk;
    int c;
    int nOutputs = 0;
    int fCheckAnd = 1;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Oah" ) ) != EOF )
    {
        switch ( c )
        {
        case 'O':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-O\" should be followed by an integer.\n" );
                goto usage;
            }
            nOutputs = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nOutputs < 0 )
                goto usage;
            break;
        case 'a':
            fCheckAnd ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            Abc_Print( -2, "Unknown switch.\n");
            goto usage;
        }
    }

    if ( pAbc->pCex == NULL )
    {
        Abc_Print( 1, "There is no current cex.\n");
        return 0;
    }

    if ( !fCheckAnd )
    {
        // check the main AIG
        pNtk = Abc_FrameReadNtk(pAbc);
        if ( pNtk == NULL )
            Abc_Print( 1, "Main AIG: There is no current network.\n");
        else if ( !Abc_NtkIsStrash(pNtk) )
            Abc_Print( 1, "Main AIG: The current network is not an AIG.\n");
        else if ( Abc_NtkPiNum(pNtk) != pAbc->pCex->nPis )
            Abc_Print( 1, "Main AIG: The number of PIs (%d) is different from cex (%d).\n", Abc_NtkPiNum(pNtk), pAbc->pCex->nPis );
        else
        {
            extern int Abc_NtkVerifyCex( Abc_Ntk_t * pNtk, Abc_Cex_t * p );
            int iPoOld = pAbc->pCex->iPo;
            pAbc->pCex->iPo = Abc_NtkVerifyCex( pNtk, pAbc->pCex );
            if ( pAbc->pCex->iPo == -1 )
                Abc_Print( 1, "Main AIG: The cex does not fail any outputs.\n" );
            else if ( iPoOld != pAbc->pCex->iPo )
                Abc_Print( 1, "Main AIG: The cex refined PO %d instead of PO %d.\n", pAbc->pCex->iPo, iPoOld );
            else
                Abc_Print( 1, "Main AIG: The cex is correct.\n" );
        }
    }
    else
    {
        // check the AND AIG
        if ( pAbc->pGia == NULL )
            Abc_Print( 1, "And  AIG: There is no current network.\n");
        else if ( Gia_ManPiNum(pAbc->pGia) != pAbc->pCex->nPis )
            Abc_Print( 1, "And  AIG: The number of PIs (%d) is different from cex (%d).\n", Gia_ManPiNum(pAbc->pGia), pAbc->pCex->nPis );
        else
        {
            int iPoOld = pAbc->pCex->iPo;
            pAbc->pCex->iPo = Gia_ManFindFailedPoCex( pAbc->pGia, pAbc->pCex, nOutputs );
            if ( pAbc->pCex->iPo == -1 )
                Abc_Print( 1, "And  AIG: The cex does not fail any outputs.\n" );
            else if ( iPoOld != pAbc->pCex->iPo )
                Abc_Print( 1, "And  AIG: The cex refined PO %d instead of PO %d.\n", pAbc->pCex->iPo, iPoOld );
            else
                Abc_Print( 1, "And  AIG: The cex is correct.\n" );
        }
    }
    return 0;

usage:
    Abc_Print( -2, "usage: testcex [-O num] [-ah]\n" );
    Abc_Print( -2, "\t         tests the current cex against the current AIG or the &-AIG\n" );
    Abc_Print( -2, "\t-O num : the number of real POs in the PO list [default = %d]\n", nOutputs );
    Abc_Print( -2, "\t-a     : toggle checking the current AIG or the &-AIG [default = %s]\n", fCheckAnd ? "&-AIG": "current AIG" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}